

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O2

OptionalStorage<llvm::DWARFDebugNames::Entry,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::operator=
          (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *this,Entry *y)

{
  if (this->hasVal == true) {
    DWARFDebugNames::Entry::operator=((Entry *)this,y);
  }
  else {
    DWARFDebugNames::Entry::Entry((Entry *)this,y);
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T &&y) {
    if (hasValue()) {
      value = std::move(y);
    } else {
      ::new ((void *)std::addressof(value)) T(std::move(y));
      hasVal = true;
    }
    return *this;
  }